

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

path * __thiscall
MPL::detail::ModelPackageImpl::getItemPath
          (path *__return_storage_ptr__,ModelPackageImpl *this,string *name,string *author)

{
  path local_78;
  path local_50;
  string *local_28;
  string *author_local;
  string *name_local;
  ModelPackageImpl *this_local;
  
  local_28 = author;
  author_local = name;
  name_local = (string *)this;
  this_local = (ModelPackageImpl *)__return_storage_ptr__;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_50,author,auto_format);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_78,author_local,auto_format);
  std::filesystem::__cxx11::operator/(__return_storage_ptr__,&local_50,&local_78);
  std::filesystem::__cxx11::path::~path(&local_78);
  std::filesystem::__cxx11::path::~path(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path ModelPackageImpl::getItemPath(const std::string& name, const std::string& author) const {
    return std::filesystem::path(author) / name;
}